

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

ssa_edge_t_conflict
add_ssa_edge_1(gen_ctx_t gen_ctx,bb_insn_t_conflict def,int def_op_num,bb_insn_t_conflict use,
              int use_op_num,int dup_p)

{
  MIR_op_t *pMVar1;
  MIR_insn_t pMVar2;
  ssa_edge_t psVar3;
  ssa_edge_t_conflict psVar4;
  
  psVar4 = (ssa_edge_t_conflict)gen_malloc(gen_ctx,0x28);
  if ((0xffff < def_op_num) || ((use_op_num | def_op_num) < 0)) {
    __assert_fail("use_op_num >= 0 && def_op_num >= 0 && def_op_num < (1 << 16)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x943,"ssa_edge_t add_ssa_edge_1(gen_ctx_t, bb_insn_t, int, bb_insn_t, int, int)"
                 );
  }
  pMVar2 = def->insn;
  if ((def_op_num == 0) && (*(int *)&pMVar2->field_0x18 == 0xa7)) {
    __assert_fail("def->insn->code != MIR_CALL || def_op_num != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x944,"ssa_edge_t add_ssa_edge_1(gen_ctx_t, bb_insn_t, int, bb_insn_t, int, int)"
                 );
  }
  psVar4->flag = '\0';
  psVar4->def = def;
  psVar4->def_op_num = (uint16_t)def_op_num;
  psVar4->use = use;
  psVar4->use_op_num = use_op_num;
  if ((dup_p == 0) && (use->insn->ops[(uint)use_op_num].data != (void *)0x0)) {
    __assert_fail("dup_p || use->insn->ops[use_op_num].data == ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x94a,"ssa_edge_t add_ssa_edge_1(gen_ctx_t, bb_insn_t, int, bb_insn_t, int, int)"
                 );
  }
  use->insn->ops[(uint)use_op_num].data = psVar4;
  pMVar1 = pMVar2->ops + (uint)def_op_num;
  psVar3 = (ssa_edge_t)pMVar1->data;
  psVar4->next_use = psVar3;
  if (psVar3 != (ssa_edge_t)0x0) {
    psVar3->prev_use = psVar4;
  }
  psVar4->prev_use = (ssa_edge_t)0x0;
  pMVar1->data = psVar4;
  return psVar4;
}

Assistant:

static ssa_edge_t add_ssa_edge_1 (gen_ctx_t gen_ctx, bb_insn_t def, int def_op_num, bb_insn_t use,
                                  int use_op_num, int dup_p MIR_UNUSED) {
  MIR_op_t *op_ref;
  ssa_edge_t ssa_edge = gen_malloc (gen_ctx, sizeof (struct ssa_edge));

  gen_assert (use_op_num >= 0 && def_op_num >= 0 && def_op_num < (1 << 16));
  gen_assert (def->insn->code != MIR_CALL || def_op_num != 0);
  ssa_edge->flag = FALSE;
  ssa_edge->def = def;
  ssa_edge->def_op_num = def_op_num;
  ssa_edge->use = use;
  ssa_edge->use_op_num = use_op_num;
  gen_assert (dup_p || use->insn->ops[use_op_num].data == NULL);
  use->insn->ops[use_op_num].data = ssa_edge;
  op_ref = &def->insn->ops[def_op_num];
  ssa_edge->next_use = op_ref->data;
  if (ssa_edge->next_use != NULL) ssa_edge->next_use->prev_use = ssa_edge;
  ssa_edge->prev_use = NULL;
  op_ref->data = ssa_edge;
  return ssa_edge;
}